

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O1

void feat_s3_1x39_cep2feat(feat_t *fcb,mfcc_t **mfc,mfcc_t **feat)

{
  int iVar1;
  mfcc_t *pmVar2;
  mfcc_t *pmVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x1f0,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->cepsize != 0xd) {
    __assert_fail("feat_cepsize(fcb) == 13",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x1f1,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->n_stream != 1) {
    __assert_fail("feat_n_stream(fcb) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x1f2,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (*fcb->stream_len == 0x27) {
    if (fcb->window_size == 3) {
      pmVar2 = *feat;
      pmVar3 = *mfc;
      uVar8 = *(undefined8 *)(pmVar3 + 1);
      uVar9 = *(undefined8 *)(pmVar3 + 3);
      uVar10 = *(undefined8 *)(pmVar3 + 5);
      uVar11 = *(undefined8 *)(pmVar3 + 7);
      uVar12 = *(undefined8 *)(pmVar3 + 0xb);
      *(undefined8 *)(pmVar2 + 8) = *(undefined8 *)(pmVar3 + 9);
      *(undefined8 *)(pmVar2 + 10) = uVar12;
      *(undefined8 *)(pmVar2 + 4) = uVar10;
      *(undefined8 *)(pmVar2 + 6) = uVar11;
      *(undefined8 *)pmVar2 = uVar8;
      *(undefined8 *)(pmVar2 + 2) = uVar9;
      pmVar2 = *feat;
      iVar1 = fcb->cepsize;
      lVar13 = (long)iVar1;
      uVar15 = iVar1 - 1;
      pfVar4 = (float *)mfc[-2];
      pfVar5 = (float *)mfc[2];
      if (1 < lVar13) {
        uVar16 = 0;
        do {
          pmVar2[lVar13 + (uVar16 - 1)] = (mfcc_t)(pfVar5[uVar16 + 1] - pfVar4[uVar16 + 1]);
          uVar16 = uVar16 + 1;
        } while (uVar15 != uVar16);
      }
      lVar17 = (long)(int)uVar15;
      pmVar2[lVar13 + lVar17 + -1] = **mfc;
      pmVar2[lVar13 + lVar17] = (mfcc_t)(*pfVar5 - *pfVar4);
      pfVar4 = (float *)mfc[3];
      pfVar5 = (float *)mfc[-3];
      pfVar6 = (float *)mfc[-1];
      pfVar7 = (float *)mfc[1];
      pmVar2[lVar13 + lVar17 + 1] = (mfcc_t)((*pfVar4 - *pfVar6) - (*pfVar7 - *pfVar5));
      if (1 < iVar1) {
        lVar14 = 0;
        do {
          *(float *)((long)pmVar2 + lVar14 + lVar17 * 4 + lVar13 * 4 + 8) =
               (*(float *)((long)pfVar4 + lVar14 + 4) - *(float *)((long)pfVar6 + lVar14 + 4)) -
               (*(float *)((long)pfVar7 + lVar14 + 4) - *(float *)((long)pfVar5 + lVar14 + 4));
          lVar14 = lVar14 + 4;
        } while ((ulong)uVar15 << 2 != lVar14);
      }
      return;
    }
    __assert_fail("feat_window_size(fcb) == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,500,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  __assert_fail("feat_stream_len(fcb, 0) == 39",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,499,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
}

Assistant:

static void
feat_s3_1x39_cep2feat(feat_t * fcb, mfcc_t ** mfc, mfcc_t ** feat)
{
    mfcc_t *f;
    mfcc_t *w, *_w;
    mfcc_t *w1, *w_1, *_w1, *_w_1;
    mfcc_t d1, d2;
    int32 i;

    assert(fcb);
    assert(feat_cepsize(fcb) == 13);
    assert(feat_n_stream(fcb) == 1);
    assert(feat_stream_len(fcb, 0) == 39);
    assert(feat_window_size(fcb) == 3);

    /* CEP; skip C0 */
    memcpy(feat[0], mfc[0] + 1, (feat_cepsize(fcb) - 1) * sizeof(mfcc_t));
    /*
     * DCEP: mfc[2] - mfc[-2];
     */
    f = feat[0] + feat_cepsize(fcb) - 1;
    w = mfc[2] + 1;             /* +1 to skip C0 */
    _w = mfc[-2] + 1;

    for (i = 0; i < feat_cepsize(fcb) - 1; i++)
        f[i] = w[i] - _w[i];

    /* POW: C0, DC0, D2C0 */
    f += feat_cepsize(fcb) - 1;

    f[0] = mfc[0][0];
    f[1] = mfc[2][0] - mfc[-2][0];

    d1 = mfc[3][0] - mfc[-1][0];
    d2 = mfc[1][0] - mfc[-3][0];
    f[2] = d1 - d2;

    /* D2CEP: (mfc[3] - mfc[-1]) - (mfc[1] - mfc[-3]) */
    f += 3;

    w1 = mfc[3] + 1;            /* Final +1 to skip C0 */
    _w1 = mfc[-1] + 1;
    w_1 = mfc[1] + 1;
    _w_1 = mfc[-3] + 1;

    for (i = 0; i < feat_cepsize(fcb) - 1; i++) {
        d1 = w1[i] - _w1[i];
        d2 = w_1[i] - _w_1[i];

        f[i] = d1 - d2;
    }
}